

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O2

void anon_unknown.dwarf_276681::readImage(char *fileName,uint correctChecksum)

{
  Rgba RVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 uVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  Array<Imf_3_4::Rgba> pixels;
  RgbaInputFile in;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"file ");
  poVar4 = std::operator<<(poVar4,fileName);
  std::operator<<(poVar4," ");
  std::ostream::flush();
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile(&in,fileName,iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout,"version ");
  iVar3 = Imf_3_4::RgbaInputFile::version();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4," ");
  std::ostream::flush();
  piVar5 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar3 = *piVar5;
  iVar8 = (piVar5[2] - iVar3) + 1;
  iVar2 = piVar5[1];
  uVar9 = ((piVar5[3] - iVar2) + 1) * iVar8;
  Imf_3_4::Array<Imf_3_4::Rgba>::Array(&pixels,(long)(int)uVar9);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            ((Rgba *)&in,(ulong)(pixels._data + (-(long)iVar3 - (long)(iVar2 * iVar8))),1);
  lVar6 = Imf_3_4::RgbaInputFile::dataWindow();
  iVar3 = *(int *)(lVar6 + 4);
  Imf_3_4::RgbaInputFile::dataWindow();
  Imf_3_4::RgbaInputFile::readPixels((int)&in,iVar3);
  uVar7 = 0;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar7;
  }
  uVar9 = 0;
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    RVar1 = pixels._data[uVar7];
    auVar11._8_8_ = 0;
    auVar11._0_2_ = RVar1.r._h;
    auVar11._2_2_ = RVar1.g._h;
    auVar11._4_2_ = RVar1.b._h;
    auVar11._6_2_ = RVar1.a._h;
    uVar12 = RVar1._4_4_;
    auVar13._4_4_ = uVar12;
    auVar13._0_4_ = uVar12;
    auVar13._8_4_ = uVar12;
    auVar13._12_4_ = uVar12;
    uVar9 = uVar9 ^ (ushort)(SUB162(auVar13 ^ auVar11,2) ^ SUB162(auVar13 ^ auVar11,0));
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"checksum = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (uVar9 == correctChecksum) {
    Imf_3_4::Array<Imf_3_4::Rgba>::~Array(&pixels);
    Imf_3_4::RgbaInputFile::~RgbaInputFile(&in);
    return;
  }
  __assert_fail("checksum == correctChecksum",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testSampleImages.cpp"
                ,0x3b,"void (anonymous namespace)::readImage(const char *, unsigned int)");
}

Assistant:

void
readImage (const char fileName[], unsigned int correctChecksum)
{
    cout << "file " << fileName << " " << flush;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in (fileName);

    cout << "version " << in.version () << " " << flush;

    const Box2i& dw = in.dataWindow ();

    int w  = dw.max.x - dw.min.x + 1;
    int h  = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels (w * h);
    in.setFrameBuffer (pixels - dx - dy * w, 1, w);
    in.readPixels (in.dataWindow ().min.y, in.dataWindow ().max.y);

    unsigned int checksum = 0;

    for (int i = 0; i < w * h; ++i)
    {
        checksum ^= pixels[i].r.bits ();
        checksum ^= pixels[i].g.bits ();
        checksum ^= pixels[i].b.bits ();
        checksum ^= pixels[i].a.bits ();
    }

    cout << "checksum = " << checksum << endl;

    assert (checksum == correctChecksum);
}